

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O3

void __thiscall GibbsSamplerFromHDP::calculateLogLikelihood(GibbsSamplerFromHDP *this)

{
  iterator __position;
  pointer puVar1;
  ostream *poVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double logLikelihood;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  probabilityMatrix;
  double local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  (*this->_vptr_GibbsSamplerFromHDP[8])(this,1);
  local_80 = 0.0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_60,&this->_thetaEx);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_78,&this->_phiEx);
  dot<double>(&local_48,&local_60,&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_60);
  uVar3 = this->_J;
  if (uVar3 == 0) {
    dVar8 = 0.0;
  }
  else {
    puVar1 = (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar8 = 0.0;
    uVar6 = 0;
    do {
      if (puVar1[uVar6] != 0) {
        uVar3 = this->_K;
        uVar5 = 0;
        do {
          if (uVar3 == 0) {
            uVar3 = 0;
          }
          else {
            uVar4 = 0;
            do {
              dVar7 = log(local_48.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [*(uint *)(*(long *)&(this->_xji).
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar6].
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data + uVar5 * 4)]);
              dVar8 = dVar8 + dVar7;
              uVar4 = uVar4 + 1;
              uVar3 = this->_K;
              local_80 = dVar8;
            } while (uVar4 < uVar3);
            puVar1 = (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < puVar1[uVar6]);
        uVar3 = this->_J;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar3);
  }
  poVar2 = std::ostream::_M_insert<double>(dVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  __position._M_current =
       (this->_logLikelihood).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_logLikelihood).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->_logLikelihood,__position,&local_80);
  }
  else {
    *__position._M_current = dVar8;
    (this->_logLikelihood).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void GibbsSamplerFromHDP::calculateLogLikelihood(){//{{{
    this->calculateExpectations(true);
    double logLikelihood = 0;
    vector<vector<double> > probabilityMatrix = dot(_thetaEx, _phiEx);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            for(int k=0; k<_K; k++){
                logLikelihood += log(probabilityMatrix[j][_xji[j][i]]);
            }
        }
    }
    cout<<logLikelihood<<endl;
    _logLikelihood.push_back(logLikelihood);
}